

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_result_t * parasail_result_new_table3(int a,int b)

{
  parasail_result_t *ppVar1;
  parasail_result_extra_trace_t *ppVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t _size;
  size_t sStack_30;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_table3");
  }
  else {
    ppVar1 = parasail_result_new();
    if (ppVar1 != (parasail_result_t *)0x0) {
      ppVar2 = (parasail_result_extra_trace_t *)malloc(0x18);
      (ppVar1->field_4).trace = ppVar2;
      if (ppVar2 == (parasail_result_extra_trace_t *)0x0) {
        sStack_30 = 0x18;
      }
      else {
        puVar3 = (undefined8 *)malloc(0x20);
        ppVar2->trace_del_table = puVar3;
        if (puVar3 == (undefined8 *)0x0) {
          sStack_30 = 0x20;
        }
        else {
          sStack_30 = (ulong)(uint)(b * a) << 2;
          pvVar4 = malloc(sStack_30);
          *puVar3 = pvVar4;
          if (pvVar4 != (void *)0x0) {
            pvVar4 = malloc(sStack_30);
            puVar3[1] = pvVar4;
            if (pvVar4 != (void *)0x0) {
              pvVar4 = malloc(sStack_30);
              puVar3[2] = pvVar4;
              if (pvVar4 != (void *)0x0) {
                pvVar4 = malloc(sStack_30);
                puVar3[3] = pvVar4;
                if (pvVar4 != (void *)0x0) {
                  return ppVar1;
                }
              }
            }
          }
        }
      }
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table3",sStack_30);
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* parasail_result_new_table3(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;
    
    /* allocate only tables */
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);
    PARASAIL_NEW(result->stats->tables, parasail_result_extra_stats_tables_t);
    PARASAIL_CALLOC(result->stats->tables->score_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->matches_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->similar_table, int, a*b);
    PARASAIL_CALLOC(result->stats->tables->length_table, int, a*b);

    return result;
}